

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void binary(_Bool canAssign)

{
  TokenType TVar1;
  Precedence unaff_retaddr;
  ParseRule *rule;
  TokenType operatorType;
  
  TVar1 = parser.previous.type;
  getRule(parser.previous.type);
  parsePrecedence(unaff_retaddr);
  switch(TVar1) {
  case TOKEN_MINUS:
    emitByte('\0');
    break;
  case TOKEN_PLUS:
    emitByte('\0');
    break;
  default:
    break;
  case TOKEN_SLASH:
    emitByte('\0');
    break;
  case TOKEN_STAR:
    emitByte('\0');
    break;
  case TOKEN_BANG_EQUAL:
    emitBytes('\0','\0');
    break;
  case TOKEN_EQUAL_EQUAL:
    emitByte('\0');
    break;
  case TOKEN_GREATER:
    emitByte('\0');
    break;
  case TOKEN_GREATER_EQUAL:
    emitBytes('\0','\0');
    break;
  case TOKEN_LESS:
    emitByte('\0');
    break;
  case TOKEN_LESS_EQUAL:
    emitBytes('\0','\0');
  }
  return;
}

Assistant:

static void binary(bool canAssign) {
    TokenType operatorType = parser.previous.type;

    ParseRule *rule = getRule(operatorType);
    parsePrecedence((Precedence) (rule->precedence + 1));

    switch (operatorType) {
        case TOKEN_BANG_EQUAL:
            emitBytes(OP_EQUAL, OP_NOT);
            break;
        case TOKEN_EQUAL_EQUAL:
            emitByte(OP_EQUAL);
            break;
        case TOKEN_GREATER:
            emitByte(OP_GREATER);
            break;
        case TOKEN_GREATER_EQUAL:
            emitBytes(OP_LESS, OP_NOT);
            break;
        case TOKEN_LESS:
            emitByte(OP_LESS);
            break;
        case TOKEN_LESS_EQUAL:
            emitBytes(OP_GREATER, OP_NOT);
            break;
        case TOKEN_PLUS:
            emitByte(OP_ADD);
            break;
        case TOKEN_MINUS:
            emitByte(OP_SUBTRACT);
            break;
        case TOKEN_STAR:
            emitByte(OP_MULTIPLY);
            break;
        case TOKEN_SLASH:
            emitByte(OP_DIVIDE);
            break;
        default:
            return; // Unreachable.
    }
}